

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O3

void __thiscall adios2::core::engine::BP5Writer::DestructorClose(BP5Writer *this,bool Verbose)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,Verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"BP5 Writer \"",0xc);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(this->super_Engine).m_Name._M_dataplus._M_p,
                        (this->super_Engine).m_Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar1,"\" Destroyed without a prior Close().",0x24);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"This may result in corrupt output.",0x22);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  UpdateActiveFlag(this,false);
  (this->super_Engine).m_IsOpen = false;
  return;
}

Assistant:

void BP5Writer::DestructorClose(bool Verbose) noexcept
{
    if (Verbose)
    {
        std::cerr << "BP5 Writer \"" << m_Name << "\" Destroyed without a prior Close()."
                  << std::endl;
        std::cerr << "This may result in corrupt output." << std::endl;
    }
    // close metadata index file
    UpdateActiveFlag(false);
    m_IsOpen = false;
}